

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_exp>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [24];
  long *in_RDI;
  float fVar26;
  float fVar27;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_exp op;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  int local_123c;
  undefined8 local_1238;
  undefined8 local_1230;
  undefined8 local_1228;
  undefined4 local_1220;
  long local_1218;
  undefined4 local_1210;
  undefined4 local_120c;
  undefined4 local_1208;
  undefined4 local_1204;
  undefined4 local_1200;
  undefined8 local_11f8;
  undefined1 (*local_11f0) [32];
  int local_11e8;
  int local_11e4;
  int local_11e0;
  int local_11dc;
  int local_11d8;
  int local_11d4;
  int local_11d0;
  undefined1 local_11c9 [9];
  long *local_11c0;
  undefined1 local_11b5;
  int local_11b4;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  undefined8 *local_1190;
  undefined1 (*local_1188) [32];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined1 (*local_1150) [32];
  undefined1 (*local_1148) [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined1 (*local_1130) [32];
  long local_1128;
  undefined4 local_111c;
  long local_1118;
  undefined1 (*local_1110) [32];
  undefined4 local_1104;
  int local_1100;
  int local_10fc;
  undefined8 *local_10f8;
  undefined4 local_10ec;
  long local_10e8;
  undefined8 *local_10d8;
  undefined8 *local_10b0;
  undefined1 *local_10a8;
  undefined8 *local_10a0;
  undefined1 *local_1098;
  undefined1 (*local_1090) [32];
  undefined1 *local_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined1 local_1040 [32];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [8];
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined1 local_fa0 [32];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined1 local_ee0 [32];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 local_ea0 [32];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 *local_db8;
  undefined8 *local_db0;
  float *local_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float *local_d58;
  undefined1 *local_d50;
  float *local_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float *local_cf8;
  undefined1 *local_cf0;
  float *local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float *local_c98;
  undefined1 *local_c90;
  float *local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float *local_c38;
  undefined1 *local_c30;
  float *local_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float *local_bd8;
  undefined1 *local_bd0;
  float *local_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  float *local_b78;
  float *local_b70;
  undefined1 *local_b68;
  float local_b60 [2];
  float afStack_b58 [2];
  float afStack_b50 [2];
  float afStack_b48 [2];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 *local_b18;
  float *local_b10;
  undefined1 *local_b08;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  float local_ac0 [2];
  float afStack_ab8 [2];
  float afStack_ab0 [2];
  float afStack_aa8 [2];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 *local_a78;
  float *local_a70;
  undefined1 *local_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20 [2];
  float afStack_a18 [2];
  float afStack_a10 [2];
  float afStack_a08 [2];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0 [2];
  float afStack_9d8 [2];
  float afStack_9d0 [2];
  float afStack_9c8 [2];
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined4 uStack_9a4;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_920 [2];
  float afStack_918 [2];
  float afStack_910 [2];
  float afStack_908 [2];
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8e0 [2];
  float afStack_8d8 [2];
  float afStack_8d0 [2];
  float afStack_8c8 [2];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0 [2];
  float afStack_898 [2];
  float afStack_890 [2];
  float afStack_888 [2];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined4 local_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined1 local_510 [16];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined1 local_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined4 local_414;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 *local_328;
  float *local_320;
  undefined1 *local_318;
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2f0 [2];
  float afStack_2e8 [2];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 *local_2c8;
  float *local_2c0;
  undefined1 *local_2b8;
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290 [2];
  float afStack_288 [2];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 *local_268;
  undefined8 *local_260;
  float *local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float *local_208;
  undefined1 *local_200;
  float *local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float *local_1a8;
  undefined1 *local_1a0;
  float *local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float *local_148;
  undefined1 *local_140;
  float *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float *local_e8;
  undefined1 *local_e0;
  float *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0 [2];
  float afStack_a8 [2];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float *local_88;
  undefined1 *local_80;
  float *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50 [2];
  float afStack_48 [2];
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  local_11d0 = *(int *)((long)in_RDI + 0x2c);
  local_11d4 = (int)in_RDI[6];
  local_11d8 = *(int *)((long)in_RDI + 0x34);
  local_11dc = (int)in_RDI[7];
  local_11e0 = (int)in_RDI[3];
  local_11e4 = local_11d0 * local_11d4 * local_11d8 * local_11e0;
  local_11c0 = in_RDI;
  for (local_11e8 = 0; local_11e8 < local_11dc; local_11e8 = local_11e8 + 1) {
    local_11a8 = &local_1238;
    local_10fc = *(int *)((long)local_11c0 + 0x2c);
    local_1100 = (int)local_11c0[6];
    local_1104 = *(undefined4 *)((long)local_11c0 + 0x34);
    local_1110 = (undefined1 (*) [32])
                 (*local_11c0 + local_11c0[8] * (long)local_11e8 * local_11c0[2]);
    local_1118 = local_11c0[2];
    local_111c = (undefined4)local_11c0[3];
    local_1128 = local_11c0[4];
    local_10f8 = &local_1238;
    local_10e8 = (long)local_10fc * (long)local_1100 * local_1118;
    local_11a0 = &local_1238;
    local_1190 = &local_1238;
    local_10ec = 0x10;
    local_11b4 = local_11e8;
    local_11b5 = 1;
    local_1238 = 0;
    local_1228 = 0;
    local_1220 = 0;
    local_1210 = 0;
    local_120c = 0;
    local_1208 = 0;
    local_1204 = 0;
    local_1200 = 0;
    local_11f8 = 0;
    local_1230 = 0;
    local_11f0 = local_1110;
    for (local_123c = 0; local_123c + 7 < local_11e4; local_123c = local_123c + 8) {
      local_1188 = local_11f0;
      uStack_e10 = *(undefined8 *)(*local_11f0 + 0x10);
      uStack_e08 = *(undefined8 *)(*local_11f0 + 0x18);
      local_10a8 = local_11c9;
      local_10b0 = &local_1260;
      local_ee0 = ZEXT832(0) << 0x20;
      local_1020 = 0x3f8000003f800000;
      uStack_1018 = 0x3f8000003f800000;
      uStack_1010 = 0x3f8000003f800000;
      uStack_1008 = 0x3f8000003f800000;
      local_fa0._0_8_ = SUB168(*(undefined1 (*) [16])*local_11f0,0);
      local_e20 = local_fa0._0_8_;
      local_fa0._8_8_ = SUB168(*(undefined1 (*) [16])*local_11f0,8);
      uStack_e18 = local_fa0._8_8_;
      local_e40 = 0x42b0c0a542b0c0a5;
      uStack_e38 = 0x42b0c0a542b0c0a5;
      uStack_e30 = 0x42b0c0a542b0c0a5;
      uStack_e28 = 0x42b0c0a542b0c0a5;
      auVar3._8_8_ = 0x42b0c0a542b0c0a5;
      auVar3._0_8_ = 0x42b0c0a542b0c0a5;
      auVar3._16_8_ = 0x42b0c0a542b0c0a5;
      auVar3._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(*local_11f0,auVar3);
      local_fa0._0_8_ = auVar5._0_8_;
      local_de0 = local_fa0._0_8_;
      local_fa0._8_8_ = auVar5._8_8_;
      uStack_dd8 = local_fa0._8_8_;
      local_fa0._16_8_ = auVar5._16_8_;
      uStack_dd0 = local_fa0._16_8_;
      local_fa0._24_8_ = auVar5._24_8_;
      uStack_dc8 = local_fa0._24_8_;
      local_e00 = 0xc2b0c0a5c2b0c0a5;
      uStack_df8 = 0xc2b0c0a5c2b0c0a5;
      uStack_df0 = 0xc2b0c0a5c2b0c0a5;
      uStack_de8 = 0xc2b0c0a5c2b0c0a5;
      auVar6._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar5,auVar6);
      local_db8 = local_fa0;
      local_b70 = ::_ps256_cephes_LOG2EF;
      local_b78 = ::_ps256_0p5;
      local_fa0._0_8_ = auVar3._0_8_;
      uVar7 = local_fa0._0_8_;
      local_fa0._8_8_ = auVar3._8_8_;
      uVar8 = local_fa0._8_8_;
      local_fa0._16_8_ = auVar3._16_8_;
      uVar9 = local_fa0._16_8_;
      local_fa0._24_8_ = auVar3._24_8_;
      uVar10 = local_fa0._24_8_;
      local_b60[0] = 1.442695;
      local_b60[1] = 1.442695;
      afStack_b58[0] = 1.442695;
      afStack_b58[1] = 1.442695;
      afStack_b50[0] = 1.442695;
      afStack_b50[1] = 1.442695;
      afStack_b48[0] = 1.442695;
      afStack_b48[1] = 1.442695;
      local_b40._0_4_ = auVar3._0_4_;
      local_b40._4_4_ = auVar3._4_4_;
      uStack_b38._0_4_ = auVar3._8_4_;
      uStack_b38._4_4_ = auVar3._12_4_;
      uStack_b30._0_4_ = auVar3._16_4_;
      uStack_b30._4_4_ = auVar3._20_4_;
      uStack_b28._0_4_ = auVar3._24_4_;
      uStack_9a4 = 0x3fb8aa3b;
      local_9c0 = (float)local_b40 * 1.442695;
      fStack_9bc = local_b40._4_4_ * 1.442695;
      fStack_9b8 = (float)uStack_b38 * 1.442695;
      fStack_9b4 = uStack_b38._4_4_ * 1.442695;
      fStack_9b0 = (float)uStack_b30 * 1.442695;
      fStack_9ac = uStack_b30._4_4_ * 1.442695;
      fStack_9a8 = (float)uStack_b28 * 1.442695;
      local_9e0[0] = 0.5;
      local_9e0[1] = 0.5;
      afStack_9d8[0] = 0.5;
      afStack_9d8[1] = 0.5;
      afStack_9d0[0] = 0.5;
      afStack_9d0[1] = 0.5;
      afStack_9c8[0] = 0.5;
      afStack_9c8[1] = 0.5;
      local_fe0._4_4_ = fStack_9bc + 0.5;
      local_fe0._0_4_ = local_9c0 + 0.5;
      uStack_fd8._0_4_ = fStack_9b8 + 0.5;
      uStack_fd8._4_4_ = fStack_9b4 + 0.5;
      uStack_fd0._0_4_ = fStack_9b0 + 0.5;
      uStack_fd0._4_4_ = fStack_9ac + 0.5;
      uStack_fc8._0_4_ = fStack_9a8 + 0.5;
      uStack_fc8._4_4_ = 0x3ff8aa3b;
      auVar6 = vroundps_avx(_local_fe0,1);
      auVar5 = vcmpps_avx(_local_fe0,auVar6,1);
      local_1040._0_8_ = auVar5._0_8_;
      local_f40 = local_1040._0_8_;
      local_1040._8_8_ = auVar5._8_8_;
      uStack_f38 = local_1040._8_8_;
      local_1040._16_8_ = auVar5._16_8_;
      uStack_f30 = local_1040._16_8_;
      local_1040._24_8_ = auVar5._24_8_;
      uStack_f28 = local_1040._24_8_;
      local_f60 = 0x3f8000003f800000;
      uStack_f58 = 0x3f8000003f800000;
      uStack_f50 = 0x3f8000003f800000;
      uStack_f48 = 0x3f8000003f800000;
      auVar12._8_8_ = 0x3f8000003f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      auVar12._16_8_ = 0x3f8000003f800000;
      auVar12._24_8_ = 0x3f8000003f800000;
      local_1040 = vandps_avx(auVar5,auVar12);
      local_fc0 = auVar6._0_8_;
      local_f00 = local_fc0;
      uStack_fb8 = auVar6._8_8_;
      uStack_ef8 = uStack_fb8;
      uStack_fb0 = auVar6._16_8_;
      uStack_ef0 = uStack_fb0;
      uStack_fa8 = auVar6._24_8_;
      uStack_ee8 = uStack_fa8;
      local_f20 = local_1040._0_8_;
      uStack_f18 = local_1040._8_8_;
      uStack_f10 = local_1040._16_8_;
      uStack_f08 = local_1040._24_8_;
      _local_fe0 = vsubps_avx(auVar6,local_1040);
      local_b08 = local_fe0;
      local_a70 = ::_ps256_cephes_exp_C1;
      local_a40 = local_fa0._0_8_;
      uStack_a38 = local_fa0._8_8_;
      uStack_a30 = local_fa0._16_8_;
      uStack_a28 = local_fa0._24_8_;
      local_a20[0] = 0.6933594;
      local_a20[1] = 0.6933594;
      afStack_a18[0] = 0.6933594;
      afStack_a18[1] = 0.6933594;
      afStack_a10[0] = 0.6933594;
      afStack_a10[1] = 0.6933594;
      afStack_a08[0] = 0.6933594;
      afStack_a08[1] = 0.6933594;
      local_a00._0_4_ = local_fe0._0_4_;
      local_a00._4_4_ = local_fe0._4_4_;
      uStack_9f8._0_4_ = local_fe0._8_4_;
      uStack_9f8._4_4_ = local_fe0._12_4_;
      uStack_9f0._0_4_ = local_fe0._16_4_;
      uStack_9f0._4_4_ = local_fe0._20_4_;
      uStack_9e8._0_4_ = local_fe0._24_4_;
      uStack_9e8._4_4_ = local_fe0._28_4_;
      fStack_a44 = uStack_9e8._4_4_;
      local_a60 = (float)local_a00 * 0.6933594;
      fStack_a5c = local_a00._4_4_ * 0.6933594;
      fStack_a58 = (float)uStack_9f8 * 0.6933594;
      fStack_a54 = uStack_9f8._4_4_ * 0.6933594;
      fStack_a50 = (float)uStack_9f0 * 0.6933594;
      fStack_a4c = uStack_9f0._4_4_ * 0.6933594;
      fStack_a48 = (float)uStack_9e8 * 0.6933594;
      auVar14._4_4_ = fStack_a5c;
      auVar14._0_4_ = local_a60;
      auVar14._8_4_ = fStack_a58;
      auVar14._12_4_ = fStack_a54;
      auVar14._16_4_ = fStack_a50;
      auVar14._20_4_ = fStack_a4c;
      auVar14._24_4_ = fStack_a48;
      auVar14._28_4_ = uStack_9e8._4_4_;
      auVar5 = vsubps_avx(auVar3,auVar14);
      local_b10 = ::_ps256_cephes_exp_C2;
      local_fa0._0_8_ = auVar5._0_8_;
      local_ae0 = local_fa0._0_8_;
      local_fa0._8_8_ = auVar5._8_8_;
      uStack_ad8 = local_fa0._8_8_;
      local_fa0._16_8_ = auVar5._16_8_;
      uStack_ad0 = local_fa0._16_8_;
      local_fa0._24_8_ = auVar5._24_8_;
      uStack_ac8 = local_fa0._24_8_;
      local_aa0 = local_fe0;
      uStack_a98 = uStack_fd8;
      uStack_a90 = uStack_fd0;
      uStack_a88 = uStack_fc8;
      local_ac0[0] = -0.00021219444;
      local_ac0[1] = -0.00021219444;
      afStack_ab8[0] = -0.00021219444;
      afStack_ab8[1] = -0.00021219444;
      afStack_ab0[0] = -0.00021219444;
      afStack_ab0[1] = -0.00021219444;
      afStack_aa8[0] = -0.00021219444;
      afStack_aa8[1] = -0.00021219444;
      fStack_ae4 = uStack_9e8._4_4_;
      local_b00 = (float)local_a00 * -0.00021219444;
      fStack_afc = local_a00._4_4_ * -0.00021219444;
      fStack_af8 = (float)uStack_9f8 * -0.00021219444;
      fStack_af4 = uStack_9f8._4_4_ * -0.00021219444;
      fStack_af0 = (float)uStack_9f0 * -0.00021219444;
      fStack_aec = uStack_9f0._4_4_ * -0.00021219444;
      fStack_ae8 = (float)uStack_9e8 * -0.00021219444;
      auVar13._4_4_ = fStack_afc;
      auVar13._0_4_ = local_b00;
      auVar13._8_4_ = fStack_af8;
      auVar13._12_4_ = fStack_af4;
      auVar13._16_4_ = fStack_af0;
      auVar13._20_4_ = fStack_aec;
      auVar13._24_4_ = fStack_ae8;
      auVar13._28_4_ = uStack_9e8._4_4_;
      local_fa0 = vsubps_avx(auVar5,auVar13);
      local_e80 = local_fa0._0_8_;
      uStack_e78 = local_fa0._8_8_;
      uStack_e70 = local_fa0._16_8_;
      uStack_e68 = local_fa0._24_8_;
      local_e60._0_4_ = local_fa0._0_4_;
      local_e60._4_4_ = local_fa0._4_4_;
      uStack_e58._0_4_ = local_fa0._8_4_;
      uStack_e58._4_4_ = local_fa0._12_4_;
      uStack_e50._0_4_ = local_fa0._16_4_;
      uStack_e50._4_4_ = local_fa0._20_4_;
      uStack_e48._0_4_ = local_fa0._24_4_;
      uStack_e48._4_4_ = local_fa0._28_4_;
      local_fc0 = CONCAT44(local_e60._4_4_ * local_e60._4_4_,(float)local_e60 * (float)local_e60);
      uStack_fb8._0_4_ = (float)uStack_e58 * (float)uStack_e58;
      uStack_fb8._4_4_ = uStack_e58._4_4_ * uStack_e58._4_4_;
      uStack_fb0._0_4_ = (float)uStack_e50 * (float)uStack_e50;
      uStack_fb0._4_4_ = uStack_e50._4_4_ * uStack_e50._4_4_;
      auVar25 = _local_fc0;
      uStack_fa8._0_4_ = (float)uStack_e48 * (float)uStack_e48;
      uStack_fa8._4_4_ = uStack_e48._4_4_;
      auVar3 = _local_fc0;
      local_da8 = &local_1060;
      local_bd8 = ::_ps256_cephes_exp_p1;
      local_ba0 = 0x3950696739506967;
      uStack_b98 = 0x3950696739506967;
      uStack_b90 = 0x3950696739506967;
      uStack_b88 = 0x3950696739506967;
      local_bc0 = local_fa0._0_8_;
      uStack_bb8 = local_fa0._8_8_;
      uStack_bb0 = local_fa0._16_8_;
      uStack_ba8 = local_fa0._24_8_;
      fStack_964 = uStack_e48._4_4_;
      local_980 = (float)local_e60 * 0.00019875691;
      fStack_97c = local_e60._4_4_ * 0.00019875691;
      fStack_978 = (float)uStack_e58 * 0.00019875691;
      fStack_974 = uStack_e58._4_4_ * 0.00019875691;
      fStack_970 = (float)uStack_e50 * 0.00019875691;
      fStack_96c = uStack_e50._4_4_ * 0.00019875691;
      fStack_968 = (float)uStack_e48 * 0.00019875691;
      local_9a0[0] = 0.0013981999;
      local_9a0[1] = 0.0013981999;
      afStack_998[0] = 0.0013981999;
      afStack_998[1] = 0.0013981999;
      afStack_990[0] = 0.0013981999;
      afStack_990[1] = 0.0013981999;
      afStack_988[0] = 0.0013981999;
      afStack_988[1] = 0.0013981999;
      local_c38 = ::_ps256_cephes_exp_p2;
      local_c00 = CONCAT44(fStack_97c + 0.0013981999,local_980 + 0.0013981999);
      uStack_bf8 = CONCAT44(fStack_974 + 0.0013981999,fStack_978 + 0.0013981999);
      uStack_bf0 = CONCAT44(fStack_96c + 0.0013981999,fStack_970 + 0.0013981999);
      uStack_be8 = CONCAT44(uStack_e48._4_4_ + 0.0013981999,fStack_968 + 0.0013981999);
      local_c20 = local_fa0._0_8_;
      uStack_c18 = local_fa0._8_8_;
      uStack_c10 = local_fa0._16_8_;
      uStack_c08 = local_fa0._24_8_;
      fStack_924 = uStack_e48._4_4_;
      local_940 = (local_980 + 0.0013981999) * (float)local_e60;
      fStack_93c = (fStack_97c + 0.0013981999) * local_e60._4_4_;
      fStack_938 = (fStack_978 + 0.0013981999) * (float)uStack_e58;
      fStack_934 = (fStack_974 + 0.0013981999) * uStack_e58._4_4_;
      fStack_930 = (fStack_970 + 0.0013981999) * (float)uStack_e50;
      fStack_92c = (fStack_96c + 0.0013981999) * uStack_e50._4_4_;
      fStack_928 = (fStack_968 + 0.0013981999) * (float)uStack_e48;
      local_960[0] = 0.008333452;
      local_960[1] = 0.008333452;
      afStack_958[0] = 0.008333452;
      afStack_958[1] = 0.008333452;
      afStack_950[0] = 0.008333452;
      afStack_950[1] = 0.008333452;
      afStack_948[0] = 0.008333452;
      afStack_948[1] = 0.008333452;
      local_c98 = ::_ps256_cephes_exp_p3;
      local_c60 = CONCAT44(fStack_93c + 0.008333452,local_940 + 0.008333452);
      uStack_c58 = CONCAT44(fStack_934 + 0.008333452,fStack_938 + 0.008333452);
      uStack_c50 = CONCAT44(fStack_92c + 0.008333452,fStack_930 + 0.008333452);
      uStack_c48 = CONCAT44(uStack_e48._4_4_ + 0.008333452,fStack_928 + 0.008333452);
      local_c80 = local_fa0._0_8_;
      uStack_c78 = local_fa0._8_8_;
      uStack_c70 = local_fa0._16_8_;
      uStack_c68 = local_fa0._24_8_;
      fStack_8e4 = uStack_e48._4_4_;
      local_900 = (local_940 + 0.008333452) * (float)local_e60;
      fStack_8fc = (fStack_93c + 0.008333452) * local_e60._4_4_;
      fStack_8f8 = (fStack_938 + 0.008333452) * (float)uStack_e58;
      fStack_8f4 = (fStack_934 + 0.008333452) * uStack_e58._4_4_;
      fStack_8f0 = (fStack_930 + 0.008333452) * (float)uStack_e50;
      fStack_8ec = (fStack_92c + 0.008333452) * uStack_e50._4_4_;
      fStack_8e8 = (fStack_928 + 0.008333452) * (float)uStack_e48;
      local_920[0] = 0.041665796;
      local_920[1] = 0.041665796;
      afStack_918[0] = 0.041665796;
      afStack_918[1] = 0.041665796;
      afStack_910[0] = 0.041665796;
      afStack_910[1] = 0.041665796;
      afStack_908[0] = 0.041665796;
      afStack_908[1] = 0.041665796;
      local_cf8 = ::_ps256_cephes_exp_p4;
      local_cc0 = CONCAT44(fStack_8fc + 0.041665796,local_900 + 0.041665796);
      uStack_cb8 = CONCAT44(fStack_8f4 + 0.041665796,fStack_8f8 + 0.041665796);
      uStack_cb0 = CONCAT44(fStack_8ec + 0.041665796,fStack_8f0 + 0.041665796);
      uStack_ca8 = CONCAT44(uStack_e48._4_4_ + 0.041665796,fStack_8e8 + 0.041665796);
      local_ce0 = local_fa0._0_8_;
      uStack_cd8 = local_fa0._8_8_;
      uStack_cd0 = local_fa0._16_8_;
      uStack_cc8 = local_fa0._24_8_;
      fStack_8a4 = uStack_e48._4_4_;
      local_8c0 = (local_900 + 0.041665796) * (float)local_e60;
      fStack_8bc = (fStack_8fc + 0.041665796) * local_e60._4_4_;
      fStack_8b8 = (fStack_8f8 + 0.041665796) * (float)uStack_e58;
      fStack_8b4 = (fStack_8f4 + 0.041665796) * uStack_e58._4_4_;
      fStack_8b0 = (fStack_8f0 + 0.041665796) * (float)uStack_e50;
      fStack_8ac = (fStack_8ec + 0.041665796) * uStack_e50._4_4_;
      fStack_8a8 = (fStack_8e8 + 0.041665796) * (float)uStack_e48;
      local_8e0[0] = 0.16666666;
      local_8e0[1] = 0.16666666;
      afStack_8d8[0] = 0.16666666;
      afStack_8d8[1] = 0.16666666;
      afStack_8d0[0] = 0.16666666;
      afStack_8d0[1] = 0.16666666;
      afStack_8c8[0] = 0.16666666;
      afStack_8c8[1] = 0.16666666;
      local_d58 = ::_ps256_cephes_exp_p5;
      local_d20 = CONCAT44(fStack_8bc + 0.16666666,local_8c0 + 0.16666666);
      uStack_d18 = CONCAT44(fStack_8b4 + 0.16666666,fStack_8b8 + 0.16666666);
      uStack_d10 = CONCAT44(fStack_8ac + 0.16666666,fStack_8b0 + 0.16666666);
      uStack_d08 = CONCAT44(uStack_e48._4_4_ + 0.16666666,fStack_8a8 + 0.16666666);
      local_d40 = local_fa0._0_8_;
      uStack_d38 = local_fa0._8_8_;
      uStack_d30 = local_fa0._16_8_;
      uStack_d28 = local_fa0._24_8_;
      fStack_864 = uStack_e48._4_4_;
      local_880 = (local_8c0 + 0.16666666) * (float)local_e60;
      fStack_87c = (fStack_8bc + 0.16666666) * local_e60._4_4_;
      fStack_878 = (fStack_8b8 + 0.16666666) * (float)uStack_e58;
      fStack_874 = (fStack_8b4 + 0.16666666) * uStack_e58._4_4_;
      fStack_870 = (fStack_8b0 + 0.16666666) * (float)uStack_e50;
      fStack_86c = (fStack_8ac + 0.16666666) * uStack_e50._4_4_;
      fStack_868 = (fStack_8a8 + 0.16666666) * (float)uStack_e48;
      local_8a0[0] = 0.5;
      local_8a0[1] = 0.5;
      afStack_898[0] = 0.5;
      afStack_898[1] = 0.5;
      afStack_890[0] = 0.5;
      afStack_890[1] = 0.5;
      afStack_888[0] = 0.5;
      afStack_888[1] = 0.5;
      local_db0 = &local_fc0;
      local_d80 = CONCAT44(fStack_87c + 0.5,local_880 + 0.5);
      uStack_d78 = CONCAT44(fStack_874 + 0.5,fStack_878 + 0.5);
      uStack_d70 = CONCAT44(fStack_86c + 0.5,fStack_870 + 0.5);
      uStack_d68 = CONCAT44(uStack_e48._4_4_ + 0.5,fStack_868 + 0.5);
      local_da0 = local_fc0;
      uStack_d98 = uStack_fb8;
      uStack_fb0 = auVar25._16_8_;
      uStack_d90 = uStack_fb0;
      uStack_fa8 = auVar3._24_8_;
      uStack_d88 = uStack_fa8;
      fStack_824 = uStack_e48._4_4_;
      local_840 = (local_880 + 0.5) * (float)local_e60 * (float)local_e60;
      fStack_83c = (fStack_87c + 0.5) * local_e60._4_4_ * local_e60._4_4_;
      fStack_838 = (fStack_878 + 0.5) * (float)uStack_e58 * (float)uStack_e58;
      fStack_834 = (fStack_874 + 0.5) * uStack_e58._4_4_ * uStack_e58._4_4_;
      fStack_830 = (fStack_870 + 0.5) * (float)uStack_e50 * (float)uStack_e50;
      fStack_82c = (fStack_86c + 0.5) * uStack_e50._4_4_ * uStack_e50._4_4_;
      fStack_828 = (fStack_868 + 0.5) * (float)uStack_e48 * (float)uStack_e48;
      local_860 = local_fa0._0_8_;
      uStack_858 = local_fa0._8_8_;
      uStack_850 = local_fa0._16_8_;
      uStack_848 = local_fa0._24_8_;
      local_800 = CONCAT44(fStack_83c + local_e60._4_4_,local_840 + (float)local_e60);
      uStack_7f8 = CONCAT44(fStack_834 + uStack_e58._4_4_,fStack_838 + (float)uStack_e58);
      uStack_7f0 = CONCAT44(fStack_82c + uStack_e50._4_4_,fStack_830 + (float)uStack_e50);
      uStack_7e8 = CONCAT44(uStack_e48._4_4_ + uStack_e48._4_4_,fStack_828 + (float)uStack_e48);
      local_820 = 0x3f8000003f800000;
      uStack_818 = 0x3f8000003f800000;
      uStack_810 = 0x3f8000003f800000;
      uStack_808 = 0x3f8000003f800000;
      local_1060 = local_840 + (float)local_e60 + 1.0;
      fStack_105c = fStack_83c + local_e60._4_4_ + 1.0;
      fStack_1058 = fStack_838 + (float)uStack_e58 + 1.0;
      fStack_1054 = fStack_834 + uStack_e58._4_4_ + 1.0;
      fStack_1050 = fStack_830 + (float)uStack_e50 + 1.0;
      fStack_104c = fStack_82c + uStack_e50._4_4_ + 1.0;
      fStack_1048 = fStack_828 + (float)uStack_e48 + 1.0;
      fStack_1044 = uStack_e48._4_4_ + uStack_e48._4_4_ + 1.0;
      local_7e0 = local_fe0;
      uStack_7d8 = uStack_fd8;
      uStack_7d0 = uStack_fd0;
      uStack_7c8 = uStack_fc8;
      local_1000 = CONCAT44((int)local_a00._4_4_,(int)(float)local_a00);
      uStack_ff8 = CONCAT44((int)uStack_9f8._4_4_,(int)(float)uStack_9f8);
      uStack_ff0 = CONCAT44((int)uStack_9f0._4_4_,(int)(float)uStack_9f0);
      uStack_fe8 = CONCAT44((int)uStack_9e8._4_4_,(int)(float)uStack_9e8);
      local_6e0 = local_1000;
      uStack_6d8 = uStack_ff8;
      uStack_6d0 = uStack_ff0;
      uStack_6c8 = uStack_fe8;
      local_700 = 0x7f0000007f;
      uStack_6f8 = 0x7f0000007f;
      uStack_6f0 = 0x7f0000007f;
      uStack_6e8 = 0x7f0000007f;
      local_780 = local_1000;
      uStack_778 = uStack_ff8;
      uStack_770 = uStack_ff0;
      uStack_768 = uStack_fe8;
      local_7a0 = 0x7f0000007f;
      uStack_798 = 0x7f0000007f;
      uStack_790 = 0x7f0000007f;
      uStack_788 = 0x7f0000007f;
      local_730 = 0x7f0000007f;
      uStack_728 = 0x7f0000007f;
      local_740 = 0x7f0000007f;
      uStack_738 = 0x7f0000007f;
      local_5d0 = local_1000;
      uStack_5c8 = uStack_ff8;
      local_5e0 = 0x7f0000007f;
      uStack_5d8 = 0x7f0000007f;
      auVar15._8_8_ = uStack_ff8;
      auVar15._0_8_ = local_1000;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_710 = vpaddd_avx(auVar15,auVar2);
      local_5f0 = uStack_ff0;
      uStack_5e8 = uStack_fe8;
      local_600 = 0x7f0000007f;
      uStack_5f8 = 0x7f0000007f;
      auVar1._8_8_ = uStack_fe8;
      auVar1._0_8_ = uStack_ff0;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      local_720 = vpaddd_avx(auVar1,auVar4);
      local_7c0 = local_710._0_8_;
      uStack_7b8 = local_710._8_8_;
      uStack_7b0 = local_720._0_8_;
      uStack_7a8 = local_720._8_8_;
      local_760 = local_710._0_8_;
      uStack_758 = local_710._8_8_;
      uStack_750 = local_720._0_8_;
      uStack_748 = local_720._8_8_;
      local_620 = local_710._0_8_;
      uStack_618 = local_710._8_8_;
      uStack_610 = local_720._0_8_;
      uStack_608 = local_720._8_8_;
      local_624 = 0x17;
      local_6a0 = local_710._0_8_;
      uStack_698 = local_710._8_8_;
      uStack_690 = local_720._0_8_;
      uStack_688 = local_720._8_8_;
      local_590 = local_710._0_8_;
      uStack_588 = local_710._8_8_;
      local_594 = 0x17;
      local_640 = vpslld_avx(local_710,ZEXT416(0x17));
      local_5b0 = local_720._0_8_;
      uStack_5a8 = local_720._8_8_;
      local_5b4 = 0x17;
      local_650 = vpslld_avx(local_720,ZEXT416(0x17));
      local_6c0 = local_640._0_8_;
      uStack_6b8 = local_640._8_8_;
      uStack_6b0 = local_650._0_8_;
      uStack_6a8 = local_650._8_8_;
      local_680 = local_640._0_8_;
      uStack_678 = local_640._8_8_;
      uStack_670 = local_650._0_8_;
      uStack_668 = local_650._8_8_;
      local_1000 = local_640._0_8_;
      uStack_ff8 = local_640._8_8_;
      uStack_ff0 = local_650._0_8_;
      uStack_fe8 = local_650._8_8_;
      local_f80 = local_640._0_8_;
      uStack_f78 = local_640._8_8_;
      uStack_f70 = local_650._0_8_;
      uStack_f68 = local_650._8_8_;
      local_1080 = local_640._0_8_;
      uStack_1078 = local_640._8_8_;
      uStack_1070 = local_650._0_8_;
      uStack_1068 = local_650._8_8_;
      local_ea0._4_4_ = fStack_105c;
      local_ea0._0_4_ = local_1060;
      local_ea0._8_4_ = fStack_1058;
      local_ea0._12_4_ = fStack_1054;
      local_ea0._16_4_ = fStack_1050;
      local_ea0._20_4_ = fStack_104c;
      local_ea0._24_4_ = fStack_1048;
      local_ea0._28_4_ = fStack_1044;
      local_ec0._0_4_ = local_640._0_4_;
      local_ec0._4_4_ = local_640._4_4_;
      uStack_eb8._0_4_ = local_640._8_4_;
      uStack_eb8._4_4_ = local_640._12_4_;
      uStack_eb0._0_4_ = local_650._0_4_;
      uStack_eb0._4_4_ = local_650._4_4_;
      uStack_ea8._0_4_ = local_650._8_4_;
      local_1060 = local_1060 * (float)local_ec0;
      fStack_105c = fStack_105c * local_ec0._4_4_;
      fStack_1058 = fStack_1058 * (float)uStack_eb8;
      fStack_1054 = fStack_1054 * uStack_eb8._4_4_;
      fStack_1050 = fStack_1050 * (float)uStack_eb0;
      fStack_104c = fStack_104c * uStack_eb0._4_4_;
      fStack_1048 = fStack_1048 * (float)uStack_ea8;
      local_1260 = CONCAT44(fStack_105c,local_1060);
      uStack_1258 = CONCAT44(fStack_1054,fStack_1058);
      uStack_1250 = CONCAT44(fStack_104c,fStack_1050);
      uStack_1248 = CONCAT44(fStack_1044,fStack_1048);
      local_1150 = local_11f0;
      auVar5._8_8_ = uStack_1258;
      auVar5._0_8_ = local_1260;
      auVar5._16_8_ = uStack_1250;
      auVar5._24_8_ = uStack_1248;
      *local_11f0 = auVar5;
      local_11f0 = local_11f0 + 1;
      local_1180 = local_1260;
      uStack_1178 = uStack_1258;
      uStack_1170 = uStack_1250;
      uStack_1168 = uStack_1248;
      _local_fc0 = auVar3;
      local_ec0 = local_640._0_8_;
      uStack_eb8 = local_640._8_8_;
      uStack_eb0 = local_650._0_8_;
      uStack_ea8 = local_650._8_8_;
      local_e60 = local_e80;
      uStack_e58 = uStack_e78;
      uStack_e50 = uStack_e70;
      uStack_e48 = uStack_e68;
      local_d50 = local_db8;
      local_d48 = local_da8;
      local_cf0 = local_db8;
      local_ce8 = local_da8;
      local_c90 = local_db8;
      local_c88 = local_da8;
      local_c30 = local_db8;
      local_c28 = local_da8;
      local_bd0 = local_db8;
      local_bc8 = local_da8;
      local_b68 = local_db8;
      local_b40 = uVar7;
      uStack_b38 = uVar8;
      uStack_b30 = uVar9;
      uStack_b28 = uVar10;
      local_b18 = local_db8;
      local_a78 = local_db8;
      local_a68 = local_b08;
      local_a00 = local_fe0;
      uStack_9f8 = uStack_fd8;
      uStack_9f0 = uStack_fd0;
      uStack_9e8 = uStack_fc8;
    }
    for (; local_10d8 = local_1190, local_1218 = local_1128, local_123c + 3 < local_11e4;
        local_123c = local_123c + 4) {
      local_1148 = local_11f0;
      local_3f0 = *(undefined8 *)*local_11f0;
      uStack_3e8 = *(undefined8 *)(*local_11f0 + 8);
      local_1098 = local_11c9;
      local_10a0 = &local_1270;
      local_4b0 = ZEXT816(0) << 0x20;
      local_550 = 0x3f8000003f800000;
      uStack_548 = 0x3f8000003f800000;
      local_400 = 0x42b0c0a542b0c0a5;
      uStack_3f8 = 0x42b0c0a542b0c0a5;
      auVar19._8_8_ = 0x42b0c0a542b0c0a5;
      auVar19._0_8_ = 0x42b0c0a542b0c0a5;
      auVar4 = vminps_avx(*(undefined1 (*) [16])*local_11f0,auVar19);
      local_510._0_8_ = auVar4._0_8_;
      local_3d0 = local_510._0_8_;
      local_510._8_8_ = auVar4._8_8_;
      uStack_3c8 = local_510._8_8_;
      local_3e0 = 0xc2b0c0a5c2b0c0a5;
      uStack_3d8 = 0xc2b0c0a5c2b0c0a5;
      auVar20._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar4,auVar20);
      local_510._0_8_ = auVar2._0_8_;
      uVar7 = local_510._0_8_;
      local_510._8_8_ = auVar2._8_8_;
      uVar8 = local_510._8_8_;
      local_460 = 0x3fb8aa3b3fb8aa3b;
      uStack_458 = 0x3fb8aa3b3fb8aa3b;
      local_450._0_4_ = auVar2._0_4_;
      local_450._4_4_ = auVar2._4_4_;
      uStack_448._0_4_ = auVar2._8_4_;
      uStack_448._4_4_ = auVar2._12_4_;
      local_530._4_4_ = local_450._4_4_ * 1.442695;
      local_530._0_4_ = (float)local_450 * 1.442695;
      uStack_528._0_4_ = (float)uStack_448 * 1.442695;
      uStack_528._4_4_ = uStack_448._4_4_ * 1.442695;
      local_390 = local_530;
      uStack_388 = uStack_528;
      local_3a0 = 0x3f0000003f000000;
      uStack_398 = 0x3f0000003f000000;
      local_530._0_4_ = (float)local_450 * 1.442695 + 0.5;
      local_530._4_4_ = local_450._4_4_ * 1.442695 + 0.5;
      fVar26 = (float)uStack_448 * 1.442695 + 0.5;
      fVar27 = uStack_448._4_4_ * 1.442695 + 0.5;
      uStack_528._0_4_ = fVar26;
      uStack_528._4_4_ = fVar27;
      local_370 = local_530;
      uStack_368 = uStack_528;
      local_540._4_4_ = (int)(float)local_530._4_4_;
      local_540._0_4_ = (int)(float)local_530._0_4_;
      local_540._8_4_ = (int)fVar26;
      local_540._12_4_ = (int)fVar27;
      local_360 = local_540._0_8_;
      uStack_358 = local_540._8_8_;
      auVar21._8_8_ = local_540._8_8_;
      auVar21._0_8_ = local_540._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar21);
      local_520 = auVar1._0_8_;
      local_340 = local_520;
      uStack_518 = auVar1._8_8_;
      uStack_338 = uStack_518;
      local_350 = local_530;
      uStack_348 = uStack_528;
      auVar22._8_8_ = uStack_528;
      auVar22._0_8_ = local_530;
      auVar4 = vcmpps_avx(auVar22,auVar1,1);
      local_560._0_8_ = auVar4._0_8_;
      local_4e0 = local_560._0_8_;
      local_560._8_8_ = auVar4._8_8_;
      uStack_4d8 = local_560._8_8_;
      local_4f0 = 0x3f8000003f800000;
      uStack_4e8 = 0x3f8000003f800000;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      local_560 = vpand_avx(auVar4,auVar16);
      local_4c0 = local_520;
      uStack_4b8 = uStack_518;
      local_4d0 = local_560._0_8_;
      uStack_4c8 = local_560._8_8_;
      _local_530 = vsubps_avx(auVar1,local_560);
      local_318 = local_530;
      local_2c0 = ::_ps_cephes_exp_C1;
      local_328 = local_510;
      local_2a0 = local_510._0_8_;
      uStack_298 = local_510._8_8_;
      local_290[0] = 0.6933594;
      local_290[1] = 0.6933594;
      afStack_288[0] = 0.6933594;
      afStack_288[1] = 0.6933594;
      local_280._0_4_ = local_530._0_4_;
      local_280._4_4_ = local_530._4_4_;
      uStack_278._0_4_ = local_530._8_4_;
      uStack_278._4_4_ = local_530._12_4_;
      local_2b0 = (float)local_280 * 0.6933594;
      fStack_2ac = local_280._4_4_ * 0.6933594;
      fStack_2a8 = (float)uStack_278 * 0.6933594;
      fStack_2a4 = uStack_278._4_4_ * 0.6933594;
      auVar24._4_4_ = fStack_2ac;
      auVar24._0_4_ = local_2b0;
      auVar24._8_4_ = fStack_2a8;
      auVar24._12_4_ = fStack_2a4;
      auVar4 = vsubps_avx(auVar2,auVar24);
      local_320 = ::_ps_cephes_exp_C2;
      local_510._0_8_ = auVar4._0_8_;
      local_300 = local_510._0_8_;
      local_510._8_8_ = auVar4._8_8_;
      uStack_2f8 = local_510._8_8_;
      local_2e0 = local_530;
      uStack_2d8 = uStack_528;
      local_2f0[0] = -0.00021219444;
      local_2f0[1] = -0.00021219444;
      afStack_2e8[0] = -0.00021219444;
      afStack_2e8[1] = -0.00021219444;
      local_310 = (float)local_280 * -0.00021219444;
      fStack_30c = local_280._4_4_ * -0.00021219444;
      fStack_308 = (float)uStack_278 * -0.00021219444;
      fStack_304 = uStack_278._4_4_ * -0.00021219444;
      auVar23._4_4_ = fStack_30c;
      auVar23._0_4_ = local_310;
      auVar23._8_4_ = fStack_308;
      auVar23._12_4_ = fStack_304;
      local_510 = vsubps_avx(auVar4,auVar23);
      local_480 = local_510._0_8_;
      uStack_478 = local_510._8_8_;
      local_470._0_4_ = local_510._0_4_;
      local_470._4_4_ = local_510._4_4_;
      uStack_468._0_4_ = local_510._8_4_;
      uStack_468._4_4_ = local_510._12_4_;
      local_520 = CONCAT44(local_470._4_4_ * local_470._4_4_,(float)local_470 * (float)local_470);
      uStack_518._0_4_ = (float)uStack_468 * (float)uStack_468;
      uStack_518._4_4_ = uStack_468._4_4_ * uStack_468._4_4_;
      local_258 = &local_570;
      local_88 = ::_ps_cephes_exp_p1;
      local_60 = 0x3950696739506967;
      uStack_58 = 0x3950696739506967;
      local_70 = local_510._0_8_;
      uStack_68 = local_510._8_8_;
      local_40 = (float)local_470 * 0.00019875691;
      fStack_3c = local_470._4_4_ * 0.00019875691;
      fStack_38 = (float)uStack_468 * 0.00019875691;
      fStack_34 = uStack_468._4_4_ * 0.00019875691;
      local_50[0] = 0.0013981999;
      local_50[1] = 0.0013981999;
      afStack_48[0] = 0.0013981999;
      afStack_48[1] = 0.0013981999;
      local_e8 = ::_ps_cephes_exp_p2;
      local_c0 = CONCAT44(fStack_3c + 0.0013981999,local_40 + 0.0013981999);
      uStack_b8 = CONCAT44(fStack_34 + 0.0013981999,fStack_38 + 0.0013981999);
      local_d0 = local_510._0_8_;
      uStack_c8 = local_510._8_8_;
      local_a0 = (local_40 + 0.0013981999) * (float)local_470;
      fStack_9c = (fStack_3c + 0.0013981999) * local_470._4_4_;
      fStack_98 = (fStack_38 + 0.0013981999) * (float)uStack_468;
      fStack_94 = (fStack_34 + 0.0013981999) * uStack_468._4_4_;
      local_b0[0] = 0.008333452;
      local_b0[1] = 0.008333452;
      afStack_a8[0] = 0.008333452;
      afStack_a8[1] = 0.008333452;
      local_148 = ::_ps_cephes_exp_p3;
      local_120 = CONCAT44(fStack_9c + 0.008333452,local_a0 + 0.008333452);
      uStack_118 = CONCAT44(fStack_94 + 0.008333452,fStack_98 + 0.008333452);
      local_130 = local_510._0_8_;
      uStack_128 = local_510._8_8_;
      local_100 = (local_a0 + 0.008333452) * (float)local_470;
      fStack_fc = (fStack_9c + 0.008333452) * local_470._4_4_;
      fStack_f8 = (fStack_98 + 0.008333452) * (float)uStack_468;
      fStack_f4 = (fStack_94 + 0.008333452) * uStack_468._4_4_;
      local_110[0] = 0.041665796;
      local_110[1] = 0.041665796;
      afStack_108[0] = 0.041665796;
      afStack_108[1] = 0.041665796;
      local_1a8 = ::_ps_cephes_exp_p4;
      local_180 = CONCAT44(fStack_fc + 0.041665796,local_100 + 0.041665796);
      uStack_178 = CONCAT44(fStack_f4 + 0.041665796,fStack_f8 + 0.041665796);
      local_190 = local_510._0_8_;
      uStack_188 = local_510._8_8_;
      local_160 = (local_100 + 0.041665796) * (float)local_470;
      fStack_15c = (fStack_fc + 0.041665796) * local_470._4_4_;
      fStack_158 = (fStack_f8 + 0.041665796) * (float)uStack_468;
      fStack_154 = (fStack_f4 + 0.041665796) * uStack_468._4_4_;
      local_170[0] = 0.16666666;
      local_170[1] = 0.16666666;
      afStack_168[0] = 0.16666666;
      afStack_168[1] = 0.16666666;
      local_208 = ::_ps_cephes_exp_p5;
      local_1e0 = CONCAT44(fStack_15c + 0.16666666,local_160 + 0.16666666);
      uStack_1d8 = CONCAT44(fStack_154 + 0.16666666,fStack_158 + 0.16666666);
      local_1f0 = local_510._0_8_;
      uStack_1e8 = local_510._8_8_;
      local_1c0 = (local_160 + 0.16666666) * (float)local_470;
      fStack_1bc = (fStack_15c + 0.16666666) * local_470._4_4_;
      fStack_1b8 = (fStack_158 + 0.16666666) * (float)uStack_468;
      fStack_1b4 = (fStack_154 + 0.16666666) * uStack_468._4_4_;
      local_1d0[0] = 0.5;
      local_1d0[1] = 0.5;
      afStack_1c8[0] = 0.5;
      afStack_1c8[1] = 0.5;
      local_260 = &local_520;
      local_240 = CONCAT44(fStack_1bc + 0.5,local_1c0 + 0.5);
      uStack_238 = CONCAT44(fStack_1b4 + 0.5,fStack_1b8 + 0.5);
      local_250 = local_520;
      uStack_248 = uStack_518;
      local_220 = (local_1c0 + 0.5) * (float)local_470 * (float)local_470;
      fStack_21c = (fStack_1bc + 0.5) * local_470._4_4_ * local_470._4_4_;
      fStack_218 = (fStack_1b8 + 0.5) * (float)uStack_468 * (float)uStack_468;
      fStack_214 = (fStack_1b4 + 0.5) * uStack_468._4_4_ * uStack_468._4_4_;
      local_230 = local_510._0_8_;
      uStack_228 = local_510._8_8_;
      local_3b0 = CONCAT44(fStack_21c + local_470._4_4_,local_220 + (float)local_470);
      uStack_3a8 = CONCAT44(fStack_214 + uStack_468._4_4_,fStack_218 + (float)uStack_468);
      local_3c0 = 0x3f8000003f800000;
      uStack_3b8 = 0x3f8000003f800000;
      local_570 = local_220 + (float)local_470 + 1.0;
      fStack_56c = fStack_21c + local_470._4_4_ + 1.0;
      fStack_568 = fStack_218 + (float)uStack_468 + 1.0;
      fStack_564 = fStack_214 + uStack_468._4_4_ + 1.0;
      local_380 = local_530;
      uStack_378 = uStack_528;
      local_540._4_4_ = (int)local_280._4_4_;
      local_540._0_4_ = (int)(float)local_280;
      local_540._8_4_ = (int)(float)uStack_278;
      local_540._12_4_ = (int)uStack_278._4_4_;
      local_430 = local_540._0_8_;
      uStack_428 = local_540._8_8_;
      local_440 = 0x7f0000007f;
      uStack_438 = 0x7f0000007f;
      auVar18._8_8_ = local_540._8_8_;
      auVar18._0_8_ = local_540._0_8_;
      auVar17._8_8_ = 0x7f0000007f;
      auVar17._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar18,auVar17);
      local_540._0_8_ = auVar4._0_8_;
      local_410 = local_540._0_8_;
      local_540._8_8_ = auVar4._8_8_;
      uStack_408 = local_540._8_8_;
      local_414 = 0x17;
      local_540 = vpslld_avx(auVar4,ZEXT416(0x17));
      local_500 = local_540._0_8_;
      uStack_4f8 = local_540._8_8_;
      local_580 = local_540._0_8_;
      uStack_578 = local_540._8_8_;
      local_490._4_4_ = fStack_56c;
      local_490._0_4_ = local_570;
      local_490._8_4_ = fStack_568;
      local_490._12_4_ = fStack_564;
      local_4a0._0_4_ = local_540._0_4_;
      local_4a0._4_4_ = local_540._4_4_;
      uStack_498._0_4_ = local_540._8_4_;
      uStack_498._4_4_ = local_540._12_4_;
      local_570 = local_570 * (float)local_4a0;
      fStack_56c = fStack_56c * local_4a0._4_4_;
      fStack_568 = fStack_568 * (float)uStack_498;
      fStack_564 = fStack_564 * uStack_498._4_4_;
      local_1270 = CONCAT44(fStack_56c,local_570);
      uStack_1268 = CONCAT44(fStack_564,fStack_568);
      local_1130 = local_11f0;
      auVar11._8_8_ = uStack_1268;
      auVar11._0_8_ = local_1270;
      *(undefined1 (*) [16])*local_11f0 = auVar11;
      local_11f0 = (undefined1 (*) [32])(*local_11f0 + 0x10);
      local_1140 = local_1270;
      uStack_1138 = uStack_1268;
      local_4a0 = local_540._0_8_;
      uStack_498 = local_540._8_8_;
      local_470 = local_480;
      uStack_468 = uStack_478;
      local_450 = uVar7;
      uStack_448 = uVar8;
      local_2c8 = local_328;
      local_2b8 = local_318;
      local_280 = local_530;
      uStack_278 = uStack_528;
      local_268 = local_328;
      local_200 = local_328;
      local_1f8 = local_258;
      local_1a0 = local_328;
      local_198 = local_258;
      local_140 = local_328;
      local_138 = local_258;
      local_e0 = local_328;
      local_d8 = local_258;
      local_80 = local_328;
      local_78 = local_258;
    }
    for (; local_123c < local_11e4; local_123c = local_123c + 1) {
      local_1088 = local_11c9;
      local_1090 = local_11f0;
      fVar26 = expf(*(float *)*local_11f0);
      *(float *)*local_11f0 = fVar26;
      local_11f0 = (undefined1 (*) [32])(*local_11f0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}